

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_muli_i32_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  _Bool _Var1;
  int arg2_00;
  TCGv_i32 arg2_01;
  TCGv_i32 t0;
  int32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (arg2 == 0) {
    tcg_gen_movi_i32(tcg_ctx,ret,0);
  }
  else {
    _Var1 = is_power_of_2((long)arg2);
    if (_Var1) {
      arg2_00 = ctz32(arg2);
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret,arg1,arg2_00);
    }
    else {
      arg2_01 = tcg_const_i32_aarch64(tcg_ctx,arg2);
      tcg_gen_mul_i32(tcg_ctx,ret,arg1,arg2_01);
      tcg_temp_free_i32(tcg_ctx,arg2_01);
    }
  }
  return;
}

Assistant:

void tcg_gen_muli_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    if (arg2 == 0) {
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
    } else if (is_power_of_2(arg2)) {
        tcg_gen_shli_i32(tcg_ctx, ret, arg1, ctz32(arg2));
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_mul_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}